

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_window.cpp
# Opt level: O0

bool __thiscall duckdb::WindowHashGroup::TryPrepareNextStage(WindowHashGroup *this)

{
  WindowGroupStage WVar1;
  __int_type _Var2;
  uint uVar3;
  mutex_type *in_RDI;
  lock_guard<std::mutex> prepare_guard;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  __atomic_base<unsigned_long> *in_stack_ffffffffffffffe8;
  bool local_1;
  
  ::std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)
             ,in_RDI);
  WVar1 = ::std::atomic<duckdb::WindowGroupStage>::load
                    ((atomic<duckdb::WindowGroupStage> *)
                     ((long)&in_RDI[5].super___mutex_base._M_mutex.__data.__list.__prev + 1),
                     memory_order_seq_cst);
  uVar3 = (uint)WVar1;
  if (WVar1 == SINK) {
    _Var2 = ::std::__atomic_base::operator_cast_to_unsigned_long(in_stack_ffffffffffffffe8);
    if (_Var2 == *(__int_type *)((long)&(in_RDI->super___mutex_base)._M_mutex + 8)) {
      ::std::atomic<duckdb::WindowGroupStage>::operator=
                ((atomic<duckdb::WindowGroupStage> *)CONCAT44(in_stack_ffffffffffffffe4,uVar3),
                 (WindowGroupStage)((ulong)in_RDI >> 0x38));
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else if (uVar3 == 1) {
    _Var2 = ::std::__atomic_base::operator_cast_to_unsigned_long(in_stack_ffffffffffffffe8);
    if (_Var2 == *(__int_type *)((long)&(in_RDI->super___mutex_base)._M_mutex + 0x10)) {
      ::std::atomic<duckdb::WindowGroupStage>::operator=
                ((atomic<duckdb::WindowGroupStage> *)CONCAT44(in_stack_ffffffffffffffe4,uVar3),
                 (WindowGroupStage)((ulong)in_RDI >> 0x38));
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = true;
  }
  ::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1727554);
  return local_1;
}

Assistant:

bool TryPrepareNextStage() {
		lock_guard<mutex> prepare_guard(lock);
		switch (stage.load()) {
		case WindowGroupStage::SINK:
			if (sunk == count) {
				stage = WindowGroupStage::FINALIZE;
				return true;
			}
			return false;
		case WindowGroupStage::FINALIZE:
			if (finalized == blocks) {
				stage = WindowGroupStage::GETDATA;
				return true;
			}
			return false;
		default:
			// never block in GETDATA
			return true;
		}
	}